

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash_smdb.c
# Opt level: O0

uintptr_t mpt_hash_smdb(void *data,int len)

{
  undefined8 local_30;
  uintptr_t hash;
  char *str;
  int len_local;
  void *data_local;
  
  local_30 = (void *)0x0;
  if (data == (void *)0x0) {
    data_local = (void *)0x0;
  }
  else {
    hash = (uintptr_t)data;
    str._4_4_ = len;
    if (len < 0) {
      for (; *(char *)hash != '\0'; hash = hash + 1) {
        local_30 = (void *)((long)local_30 * 0x1003f + (long)*(char *)hash);
      }
      data_local = local_30;
    }
    else {
      while (str._4_4_ != 0) {
        local_30 = (void *)((long)local_30 * 0x1003f + (long)*(char *)hash);
        hash = hash + 1;
        str._4_4_ = str._4_4_ + -1;
      }
      data_local = local_30;
    }
  }
  return (uintptr_t)data_local;
}

Assistant:

extern uintptr_t mpt_hash_smdb(const void *data, int len)
{
	const char *str;
	uintptr_t hash = 0;
	
	if (!(str = data)) {
		return 0;
	}
	if (len < 0) {
		while (*str) {
			hash = (hash * 65599) + *str++;
		}
		return hash;
	}
	while (len--) {
		hash = (hash * 65599) + *str++;
	}
	return hash;
}